

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TransformFeedbackTests::init
          (TransformFeedbackTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  Precision PVar2;
  Interpolation interpolation;
  uint uVar3;
  _func_int **pp_Var4;
  DataType DVar5;
  uint uVar6;
  TestNode *pTVar7;
  long *plVar8;
  TestNode *pTVar9;
  long lVar10;
  TestNode *pTVar11;
  char *pcVar12;
  long *extraout_RAX;
  long *plVar13;
  size_type *psVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  TestNode *local_250;
  TestNode *local_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  TestNode *local_220;
  long local_218;
  long local_210;
  TestNode *local_208;
  long local_200;
  TestNode *local_1f8;
  allocator<char> local_1e9;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  string name;
  ios_base local_138 [264];
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"position",
             "gl_Position capture using transform feedback");
  local_248 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar10 = 0;
  do {
    pcVar12 = init::primitiveTypes[lVar10].name;
    lVar16 = 0;
    local_250 = (TestNode *)lVar10;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar12,(allocator<char> *)&local_1e8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_270 = &local_260;
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        local_260 = *plVar13;
        lStack_258 = plVar8[3];
      }
      else {
        local_260 = *plVar13;
        local_270 = (long *)*plVar8;
      }
      local_268 = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar14) {
        name.field_2._M_allocated_capacity = *psVar14;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar14;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pTVar9 = (TestNode *)operator_new(0x148);
      TransformFeedback::PositionCase::PositionCase
                ((PositionCase *)pTVar9,(Context *)local_248[1]._vptr_TestNode,name._M_dataplus._M_p
                 ,glcts::fixed_sample_locations_values + 1,
                 *(deUint32 *)((long)&init::bufferModes[0].mode + lVar16),
                 init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(pTVar7,pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 == 0x10);
    lVar10 = (long)local_250 + 1;
  } while (lVar10 != 3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar7 = local_248;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,local_248->m_testCtx,"point_size",
             "gl_PointSize capture using transform feedback");
  tcu::TestNode::addChild(pTVar7,pTVar9);
  pTVar7 = (TestNode *)0x0;
  do {
    pcVar12 = init::primitiveTypes[(long)pTVar7].name;
    lVar10 = 0;
    local_250 = pTVar7;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,pcVar12,(allocator<char> *)&local_1e8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
      local_270 = &local_260;
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        local_260 = *plVar13;
        lStack_258 = plVar8[3];
      }
      else {
        local_260 = *plVar13;
        local_270 = (long *)*plVar8;
      }
      local_268 = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar14) {
        name.field_2._M_allocated_capacity = *psVar14;
        name.field_2._8_8_ = plVar8[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar14;
        name._M_dataplus._M_p = (pointer)*plVar8;
      }
      name._M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      pTVar11 = (TestNode *)operator_new(0x148);
      TransformFeedback::PointSizeCase::PointSizeCase
                ((PointSizeCase *)pTVar11,(Context *)local_248[1]._vptr_TestNode,
                 name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                 *(deUint32 *)((long)&init::bufferModes[0].mode + lVar10),
                 init::primitiveTypes[(long)pTVar7].type);
      tcu::TestNode::addChild(pTVar9,pTVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 0x10;
    } while (lVar10 == 0x10);
    pTVar7 = (TestNode *)((long)&local_250->_vptr_TestNode + 1);
  } while (pTVar7 != (TestNode *)0x3);
  pTVar9 = (TestNode *)operator_new(0x70);
  pTVar7 = local_248;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,local_248->m_testCtx,"basic_types",
             "Basic types in transform feedback");
  tcu::TestNode::addChild(pTVar7,pTVar9);
  lVar10 = 0;
  local_208 = pTVar9;
  do {
    pTVar9 = local_208;
    pTVar11 = (TestNode *)operator_new(0x70);
    local_200 = lVar10;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::bufferModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    local_210 = CONCAT44(local_210._4_4_,init::bufferModes[lVar10].mode);
    tcu::TestNode::addChild(pTVar9,pTVar11);
    lVar10 = 0;
    local_1f8 = pTVar11;
    do {
      pTVar9 = local_1f8;
      pTVar11 = (TestNode *)operator_new(0x70);
      local_220 = (TestNode *)lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::primitiveTypes[lVar10].name,
                 glcts::fixed_sample_locations_values + 1);
      local_250 = (TestNode *)CONCAT44(local_250._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(pTVar9,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_218 = lVar10;
        DVar5 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar12 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,pcVar12,(allocator<char> *)&local_1e8);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
          local_270 = &local_260;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_260 = *plVar13;
            lStack_258 = plVar8[3];
          }
          else {
            local_260 = *plVar13;
            local_270 = (long *)*plVar8;
          }
          local_268 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar14) {
            name.field_2._M_allocated_capacity = *psVar14;
            name.field_2._8_8_ = plVar8[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar14;
            name._M_dataplus._M_p = (pointer)*plVar8;
          }
          name._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,local_230 + 1);
          }
          pTVar7 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar7,(Context *)local_248[1]._vptr_TestNode,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_210,(deUint32)local_250,DVar1,PVar2,
                     (uint)(DVar5 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar7 = local_248;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_218 + 1;
      } while (lVar10 != 0x15);
      lVar10 = (long)local_220 + 1;
    } while (lVar10 != 3);
    lVar10 = local_200 + 1;
  } while (local_200 == 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar7->m_testCtx,"array","Capturing whole array in TF");
  tcu::TestNode::addChild(pTVar7,pTVar9);
  lVar10 = 0;
  local_208 = pTVar9;
  do {
    pTVar9 = local_208;
    pTVar11 = (TestNode *)operator_new(0x70);
    local_200 = lVar10;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::bufferModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    local_210 = CONCAT44(local_210._4_4_,init::bufferModes[lVar10].mode);
    tcu::TestNode::addChild(pTVar9,pTVar11);
    lVar10 = 0;
    local_1f8 = pTVar11;
    do {
      pTVar9 = local_1f8;
      pTVar11 = (TestNode *)operator_new(0x70);
      local_220 = (TestNode *)lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::primitiveTypes[lVar10].name,
                 glcts::fixed_sample_locations_values + 1);
      local_250 = (TestNode *)CONCAT44(local_250._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(pTVar9,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_218 = lVar10;
        DVar5 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar12 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,pcVar12,(allocator<char> *)&local_1e8);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
          local_270 = &local_260;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_260 = *plVar13;
            lStack_258 = plVar8[3];
          }
          else {
            local_260 = *plVar13;
            local_270 = (long *)*plVar8;
          }
          local_268 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar14) {
            name.field_2._M_allocated_capacity = *psVar14;
            name.field_2._8_8_ = plVar8[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar14;
            name._M_dataplus._M_p = (pointer)*plVar8;
          }
          name._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,local_230 + 1);
          }
          pTVar7 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicArrayCase::BasicArrayCase
                    ((BasicArrayCase *)pTVar7,(Context *)local_248[1]._vptr_TestNode,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_210,(deUint32)local_250,DVar1,PVar2,
                     (uint)(DVar5 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar7 = local_248;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_218 + 1;
      } while (lVar10 != 0x15);
      lVar10 = (long)local_220 + 1;
    } while (lVar10 != 3);
    lVar10 = local_200 + 1;
  } while (local_200 == 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar7->m_testCtx,"array_element",
             "Capturing single array element in TF");
  tcu::TestNode::addChild(pTVar7,pTVar9);
  lVar10 = 0;
  local_208 = pTVar9;
  do {
    pTVar9 = local_208;
    pTVar11 = (TestNode *)operator_new(0x70);
    local_200 = lVar10;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::bufferModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    local_210 = CONCAT44(local_210._4_4_,init::bufferModes[lVar10].mode);
    tcu::TestNode::addChild(pTVar9,pTVar11);
    lVar10 = 0;
    local_1f8 = pTVar11;
    do {
      pTVar9 = local_1f8;
      pTVar11 = (TestNode *)operator_new(0x70);
      local_220 = (TestNode *)lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::primitiveTypes[lVar10].name,
                 glcts::fixed_sample_locations_values + 1);
      local_250 = (TestNode *)CONCAT44(local_250._4_4_,init::primitiveTypes[lVar10].type);
      tcu::TestNode::addChild(pTVar9,pTVar11);
      lVar10 = 0;
      do {
        DVar1 = init::basicTypes[lVar10];
        local_218 = lVar10;
        DVar5 = glu::getDataTypeScalarType(DVar1);
        lVar10 = 0;
        do {
          PVar2 = *(Precision *)((long)init::precisions + lVar10);
          pcVar12 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_240,pcVar12,(allocator<char> *)&local_1e8);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
          local_270 = &local_260;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_260 = *plVar13;
            lStack_258 = plVar8[3];
          }
          else {
            local_260 = *plVar13;
            local_270 = (long *)*plVar8;
          }
          local_268 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          glu::getDataTypeName(DVar1);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar14) {
            name.field_2._M_allocated_capacity = *psVar14;
            name.field_2._8_8_ = plVar8[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar14;
            name._M_dataplus._M_p = (pointer)*plVar8;
          }
          name._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,local_230 + 1);
          }
          pTVar7 = (TestNode *)operator_new(0x148);
          TransformFeedback::ArrayElementCase::ArrayElementCase
                    ((ArrayElementCase *)pTVar7,(Context *)local_248[1]._vptr_TestNode,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                     (TestNodeType)local_210,(deUint32)local_250,DVar1,PVar2,
                     (uint)(DVar5 != TYPE_FLOAT));
          tcu::TestNode::addChild(pTVar11,pTVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar7 = local_248;
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar10 = local_218 + 1;
      } while (lVar10 != 0x15);
      lVar10 = (long)local_220 + 1;
    } while (lVar10 != 3);
    lVar10 = local_200 + 1;
  } while (local_200 == 0);
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,pTVar7->m_testCtx,"interpolation",
             "Different interpolation modes in transform feedback varyings");
  tcu::TestNode::addChild(pTVar7,pTVar9);
  lVar10 = 0;
  local_220 = pTVar9;
  do {
    pTVar9 = local_220;
    interpolation = init::interpModes[lVar10].interp;
    local_218 = lVar10;
    pTVar11 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar7->m_testCtx,init::interpModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar9,pTVar11);
    lVar10 = 0;
    do {
      PVar2 = init::precisions[lVar10];
      pTVar7 = (TestNode *)0x0;
      local_210 = lVar10;
      do {
        lVar10 = 0;
        local_250 = pTVar7;
        do {
          pcVar12 = glu::getPrecisionName(PVar2);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_1c8,pcVar12,&local_1e9)
          ;
          plVar8 = (long *)std::__cxx11::string::append((char *)local_1c8);
          local_1e8 = &local_1d8;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_1d8 = *plVar13;
            lStack_1d0 = plVar8[3];
          }
          else {
            local_1d8 = *plVar13;
            local_1e8 = (long *)*plVar8;
          }
          local_1e0 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
          local_240 = &local_230;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_230 = *plVar13;
            lStack_228 = plVar8[3];
          }
          else {
            local_230 = *plVar13;
            local_240 = (long *)*plVar8;
          }
          local_238 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
          local_270 = &local_260;
          plVar13 = plVar8 + 2;
          if ((long *)*plVar8 == plVar13) {
            local_260 = *plVar13;
            lStack_258 = plVar8[3];
          }
          else {
            local_260 = *plVar13;
            local_270 = (long *)*plVar8;
          }
          local_268 = plVar8[1];
          *plVar8 = (long)plVar13;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_270);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar14 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar14) {
            name.field_2._M_allocated_capacity = *psVar14;
            name.field_2._8_8_ = plVar8[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar14;
            name._M_dataplus._M_p = (pointer)*plVar8;
          }
          name._M_string_length = plVar8[1];
          *plVar8 = (long)psVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_240 != &local_230) {
            operator_delete(local_240,local_230 + 1);
          }
          if (local_1e8 != &local_1d8) {
            operator_delete(local_1e8,local_1d8 + 1);
          }
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          pTVar9 = (TestNode *)operator_new(0x148);
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar9,(Context *)local_248[1]._vptr_TestNode,
                     name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                     *(deUint32 *)((long)&init::bufferModes[0].mode + lVar10),
                     init::primitiveTypes[(long)pTVar7].type,TYPE_FLOAT_VEC4,PVar2,interpolation);
          tcu::TestNode::addChild(pTVar11,pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar9 = local_248;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 == 0x10);
        pTVar7 = (TestNode *)((long)&local_250->_vptr_TestNode + 1);
      } while (pTVar7 != (TestNode *)0x3);
      lVar10 = local_210 + 1;
    } while (lVar10 != 3);
    lVar10 = local_218 + 1;
    pTVar7 = local_248;
  } while (lVar10 != 3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,pTVar9->m_testCtx,"random",
             "Randomized transform feedback cases");
  tcu::TestNode::addChild(pTVar9,pTVar7);
  lVar10 = 0;
  local_208 = pTVar7;
  do {
    pTVar7 = local_208;
    pTVar11 = (TestNode *)operator_new(0x70);
    local_200 = lVar10;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar11,pTVar9->m_testCtx,init::bufferModes[lVar10].name,
               glcts::fixed_sample_locations_values + 1);
    uVar3 = init::bufferModes[lVar10].mode;
    tcu::TestNode::addChild(pTVar7,pTVar11);
    local_210 = CONCAT44(local_210._4_4_,uVar3);
    uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
    local_220 = (TestNode *)CONCAT44(local_220._4_4_,(uVar3 >> 4 ^ uVar3) * 0x27d4eb2d);
    lVar10 = 0;
    local_1f8 = pTVar11;
    do {
      pTVar7 = local_1f8;
      pTVar11 = (TestNode *)operator_new(0x70);
      local_218 = lVar10;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,pTVar9->m_testCtx,init::primitiveTypes[lVar10].name,
                 glcts::fixed_sample_locations_values + 1);
      uVar3 = init::primitiveTypes[lVar10].type;
      local_250 = pTVar11;
      tcu::TestNode::addChild(pTVar7,pTVar11);
      uVar17 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
      uVar17 = (uVar17 >> 4 ^ uVar17) * 0x27d4eb2d ^ (uint)local_220;
      iVar15 = 1;
      do {
        pTVar7 = (TestNode *)operator_new(0x148);
        pp_Var4 = pTVar9[1]._vptr_TestNode;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::ostream::operator<<(&name,iVar15);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_138);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar7,(TestContext *)*pp_Var4,(char *)local_270,
                   glcts::fixed_sample_locations_values + 1);
        uVar6 = (iVar15 - 1U ^ 0x3d) * 9;
        uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d ^ uVar17;
        pTVar7[1]._vptr_TestNode = pp_Var4;
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TransformFeedbackCase_02187bb0;
        pTVar7[1].m_testCtx = (TestContext *)0x0;
        pTVar7[1].m_name._M_dataplus._M_p = (pointer)0x0;
        pTVar7[1].m_name._M_string_length = 0;
        pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0;
        pTVar7[1].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar7[1].m_description._M_string_length = 0;
        pTVar7[1].m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar7[1].m_description.field_2 + 8) = 0;
        pTVar7[1].m_nodeType = (TestNodeType)local_210;
        *(uint *)&pTVar7[1].field_0x54 = uVar3;
        *(undefined4 *)
         &pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pTVar7[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar7[2]._vptr_TestNode = (_func_int **)0x0;
        pTVar7[2].m_testCtx = (TestContext *)0x0;
        pTVar7[2].m_name._M_dataplus._M_p = (pointer)0x0;
        pTVar7[2].m_name._M_string_length = 0;
        pTVar7[2].m_name.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar7[2].m_name.field_2 + 8) = 0;
        pTVar7[2].m_description._M_dataplus._M_p = (pointer)0x0;
        pTVar7[2].m_description._M_string_length = 0;
        pTVar7[2].m_description.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pTVar7[2].m_description.field_2 + 8) = 0;
        *(undefined8 *)&pTVar7[2].m_nodeType = 0;
        pTVar7[2].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined4 *)
         &pTVar7[2].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        pTVar7->_vptr_TestNode = (_func_int **)&PTR__TransformFeedbackCase_02187f10;
        *(uint *)((long)&pTVar7[2].m_children.
                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 4) = uVar6 >> 0xf ^ uVar6;
        tcu::TestNode::addChild(local_250,pTVar7);
        plVar8 = &local_260;
        if (local_270 != plVar8) {
          operator_delete(local_270,local_260 + 1);
          plVar8 = extraout_RAX;
        }
        iVar15 = iVar15 + 1;
        pTVar9 = local_248;
      } while (iVar15 != 0xb);
      lVar10 = local_218 + 1;
    } while (lVar10 != 3);
    lVar10 = local_200 + 1;
  } while (local_200 == 0);
  return (int)plVar8;
}

Assistant:

void TransformFeedbackTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} bufferModes[] =
	{
		{ "separate",		GL_SEPARATE_ATTRIBS		},
		{ "interleaved",	GL_INTERLEAVED_ATTRIBS	}
	};

	static const struct
	{
		const char*		name;
		deUint32		type;
	} primitiveTypes[] =
	{
		{ "points",			GL_POINTS			},
		{ "lines",			GL_LINES			},
		{ "triangles",		GL_TRIANGLES		}

		// Not supported by GLES3.
//		{ "line_strip",		GL_LINE_STRIP		},
//		{ "line_loop",		GL_LINE_LOOP		},
//		{ "triangle_fan",	GL_TRIANGLE_FAN		},
//		{ "triangle_strip",	GL_TRIANGLE_STRIP	}
	};

	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	static const struct
	{
		const char*		name;
		Interpolation	interp;
	} interpModes[] =
	{
		{ "smooth",		INTERPOLATION_SMOOTH	},
		{ "flat",		INTERPOLATION_FLAT		},
		{ "centroid",	INTERPOLATION_CENTROID	}
	};

	// .position
	{
		tcu::TestCaseGroup* positionGroup = new tcu::TestCaseGroup(m_testCtx, "position", "gl_Position capture using transform feedback");
		addChild(positionGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				positionGroup->addChild(new PositionCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .point_size
	{
		tcu::TestCaseGroup* pointSizeGroup = new tcu::TestCaseGroup(m_testCtx, "point_size", "gl_PointSize capture using transform feedback");
		addChild(pointSizeGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				pointSizeGroup->addChild(new PointSizeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .basic_type
	{
		tcu::TestCaseGroup* basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_types", "Basic types in transform feedback");
		addChild(basicTypeGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			basicTypeGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Capturing whole array in TF");
		addChild(arrayGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicArrayCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array_element
	{
		tcu::TestCaseGroup* arrayElemGroup = new tcu::TestCaseGroup(m_testCtx, "array_element", "Capturing single array element in TF");
		addChild(arrayElemGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayElemGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new ArrayElementCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* interpolationGroup = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Different interpolation modes in transform feedback varyings");
		addChild(interpolationGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(interpModes); modeNdx++)
		{
			Interpolation		interp		= interpModes[modeNdx].interp;
			tcu::TestCaseGroup*	modeGroup	= new tcu::TestCaseGroup(m_testCtx, interpModes[modeNdx].name, "");

			interpolationGroup->addChild(modeGroup);

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision precision = precisions[precNdx];

				for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
				{
					for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
					{
						string name = string(glu::getPrecisionName(precision)) + "_vec4_" + primitiveTypes[primitiveType].name + "_" + bufferModes[bufferMode].name;
						modeGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type, glu::TYPE_FLOAT_VEC4, precision, interp));
					}
				}
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized transform feedback cases");
		addChild(randomGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			randomGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int ndx = 0; ndx < 10; ndx++)
				{
					deUint32 seed = deInt32Hash(bufferMode) ^ deInt32Hash(primitiveType) ^ deInt32Hash(ndx);
					primitiveGroup->addChild(new RandomCase(m_context, de::toString(ndx+1).c_str(), "", bufferMode, primitiveType, seed));
				}
			}
		}
	}
}